

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive_buffer.cpp
# Opt level: O3

span<char> __thiscall
libtorrent::aux::crypto_receive_buffer::mutable_buffer(crypto_receive_buffer *this,int bytes)

{
  receive_buffer *prVar1;
  span<char> sVar2;
  
  prVar1 = this->m_connection_buffer;
  if (this->m_recv_pos != 0x7fffffff) {
    bytes = prVar1->m_packet_size - this->m_recv_pos;
  }
  sVar2.m_len = (long)bytes;
  sVar2.m_ptr = (prVar1->m_recv_buffer).m_begin +
                ((prVar1->m_recv_start - bytes) + prVar1->m_recv_pos);
  return sVar2;
}

Assistant:

span<char> crypto_receive_buffer::mutable_buffer(
	int const bytes)
{
	int const pending_decryption = (m_recv_pos != INT_MAX)
		? m_connection_buffer.packet_size() - m_recv_pos
		: bytes;
	return m_connection_buffer.mutable_buffer(pending_decryption);
}